

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommonArgProperties<Catch::ConfigData>::CommonArgProperties
          (CommonArgProperties<Catch::ConfigData> *this,
          CommonArgProperties<Catch::ConfigData> *param_1)

{
  CommonArgProperties<Catch::ConfigData> *param_1_local;
  CommonArgProperties<Catch::ConfigData> *this_local;
  
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction
            (&this->boundField,&param_1->boundField);
  std::__cxx11::string::string((string *)&this->description,(string *)&param_1->description);
  std::__cxx11::string::string((string *)&this->detail,(string *)&param_1->detail);
  std::__cxx11::string::string((string *)&this->placeholder,(string *)&param_1->placeholder);
  return;
}

Assistant:

CommonArgProperties(Detail::BoundArgFunction<ConfigT> const& _boundField) : boundField(_boundField) {}